

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool has_attribute(element_t *element,int id)

{
  attribute *paVar1;
  attribute **ppaVar2;
  
  ppaVar2 = &element->attributes;
  do {
    paVar1 = *ppaVar2;
    if (paVar1 == (attribute *)0x0) break;
    ppaVar2 = &paVar1->next;
  } while (paVar1->id != id);
  return paVar1 != (attribute *)0x0;
}

Assistant:

static inline bool has_attribute(const element_t* element, int id)
{
    const attribute_t* attribute = element->attributes;
    while(attribute != NULL) {
        if(attribute->id == id)
            return true;
        attribute = attribute->next;
    }

    return false;
}